

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-sve.c
# Opt level: O0

_Bool do_vpz_ool(DisasContext_conflict1 *s,arg_rpr_esz *a,gen_helper_gvec_reduc *fn)

{
  TCGContext_conflict1 *tcg_ctx_00;
  TCGv_ptr pTVar1;
  _Bool _Var2;
  uint32_t uVar3;
  int iVar4;
  TCGv_i32 arg;
  TCGv_i64 v;
  TCGv_ptr r;
  TCGv_ptr r_00;
  TCGv_i64 temp;
  TCGv_i32 desc;
  TCGv_ptr t_pg;
  TCGv_ptr t_zn;
  uint vsz;
  TCGContext_conflict1 *tcg_ctx;
  gen_helper_gvec_reduc *fn_local;
  arg_rpr_esz *a_local;
  DisasContext_conflict1 *s_local;
  
  tcg_ctx_00 = s->uc->tcg_ctx;
  uVar3 = vec_full_reg_size(s);
  if (fn == (gen_helper_gvec_reduc *)0x0) {
    s_local._7_1_ = false;
  }
  else {
    _Var2 = sve_access_check_aarch64(s);
    if (_Var2) {
      uVar3 = simd_desc_aarch64(uVar3,uVar3,0);
      arg = tcg_const_i32_aarch64(tcg_ctx_00,uVar3);
      v = tcg_temp_new_i64(tcg_ctx_00);
      r = tcg_temp_new_ptr(tcg_ctx_00);
      r_00 = tcg_temp_new_ptr(tcg_ctx_00);
      pTVar1 = tcg_ctx_00->cpu_env;
      iVar4 = vec_full_reg_offset(s,a->rn);
      tcg_gen_addi_ptr(tcg_ctx_00,r,pTVar1,(long)iVar4);
      pTVar1 = tcg_ctx_00->cpu_env;
      iVar4 = pred_full_reg_offset(s,a->pg);
      tcg_gen_addi_ptr(tcg_ctx_00,r_00,pTVar1,(long)iVar4);
      (*fn)(tcg_ctx_00,v,r,r_00,arg);
      tcg_temp_free_ptr(tcg_ctx_00,r);
      tcg_temp_free_ptr(tcg_ctx_00,r_00);
      tcg_temp_free_i32(tcg_ctx_00,arg);
      write_fp_dreg_aarch64(s,a->rd,v);
      tcg_temp_free_i64(tcg_ctx_00,v);
      s_local._7_1_ = true;
    }
    else {
      s_local._7_1_ = true;
    }
  }
  return s_local._7_1_;
}

Assistant:

static bool do_vpz_ool(DisasContext *s, arg_rpr_esz *a,
                       gen_helper_gvec_reduc *fn)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    unsigned vsz = vec_full_reg_size(s);
    TCGv_ptr t_zn, t_pg;
    TCGv_i32 desc;
    TCGv_i64 temp;

    if (fn == NULL) {
        return false;
    }
    if (!sve_access_check(s)) {
        return true;
    }

    desc = tcg_const_i32(tcg_ctx, simd_desc(vsz, vsz, 0));
    temp = tcg_temp_new_i64(tcg_ctx);
    t_zn = tcg_temp_new_ptr(tcg_ctx);
    t_pg = tcg_temp_new_ptr(tcg_ctx);

    tcg_gen_addi_ptr(tcg_ctx, t_zn, tcg_ctx->cpu_env, vec_full_reg_offset(s, a->rn));
    tcg_gen_addi_ptr(tcg_ctx, t_pg, tcg_ctx->cpu_env, pred_full_reg_offset(s, a->pg));
    fn(tcg_ctx, temp, t_zn, t_pg, desc);
    tcg_temp_free_ptr(tcg_ctx, t_zn);
    tcg_temp_free_ptr(tcg_ctx, t_pg);
    tcg_temp_free_i32(tcg_ctx, desc);

    write_fp_dreg(s, a->rd, temp);
    tcg_temp_free_i64(tcg_ctx, temp);
    return true;
}